

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::eliminatePivot(CLUFactor<double> *this,int prow,int pos,double eps)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  long lVar7;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double in_stack_00000010;
  int pend;
  int plen;
  int pbeg;
  double pval;
  int pcol;
  int lv;
  int m;
  int k;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  value_type vVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 local_24;
  undefined4 local_1c;
  
  uVar10 = 0xffffffff;
  local_1c = *(int *)(*(long *)(in_RDI + 0x140) + (long)in_ESI * 4);
  iVar2 = *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) + -1;
  *(int *)(*(long *)(in_RDI + 0x148) + (long)in_ESI * 4) = iVar2;
  iVar3 = local_1c + iVar2;
  iVar4 = local_1c + in_EDX;
  iVar9 = *(int *)(*(long *)(in_RDI + 0x138) + (long)iVar4 * 4);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),(long)iVar4);
  vVar8 = *pvVar6;
  *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20) + 8) =
       *(undefined8 *)(*(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20 + 8);
  **(undefined8 **)(*(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20 + 8) =
       *(undefined8 *)(*(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20);
  lVar7 = *(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20;
  *(long *)(*(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20) = lVar7;
  *(long *)(*(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20 + 8) = lVar7;
  *(undefined4 *)(*(long *)(in_RDI + 0x138) + (long)iVar4 * 4) =
       *(undefined4 *)(*(long *)(in_RDI + 0x138) + (long)iVar3 * 4);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),(long)iVar3);
  vVar1 = *pvVar6;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),(long)iVar4);
  *pvVar6 = vVar1;
  *(int *)(in_RDI + 0x208) = *(int *)(in_RDI + 0x208) + 1;
  setPivot((CLUFactor<double> *)CONCAT44(uVar10,iVar9),(int)((ulong)vVar8 >> 0x20),SUB84(vVar8,0),
           local_1c,(double)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
  if (0 < *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar9 * 4) + -1) {
    makeLvec((CLUFactor<double> *)CONCAT44(uVar10,iVar9),(int)((ulong)vVar8 >> 0x20),SUB84(vVar8,0))
    ;
  }
  for (; local_1c < iVar3; local_1c = local_1c + 1) {
    iVar4 = *(int *)(*(long *)(in_RDI + 0x138) + (long)local_1c * 4);
    *(undefined4 *)(*(long *)(in_RDI + 0x1e0) + (long)iVar4 * 4) = 1;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x120),(long)local_1c);
    *(value_type *)(*(long *)(in_RDI + 0x1b8) + (long)iVar4 * 8) = *pvVar6;
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x230) + (long)iVar4 * 0x20) + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x230) + (long)iVar4 * 0x20 + 8);
    **(undefined8 **)(*(long *)(in_RDI + 0x230) + (long)iVar4 * 0x20 + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x230) + (long)iVar4 * 0x20);
    iVar5 = (*(int *)(*(long *)(in_RDI + 0x1a0) + (long)iVar4 * 4) +
            *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar4 * 4)) -
            *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar4 * 4);
    local_24 = iVar5;
    while (*(int *)(*(long *)(in_RDI + 0x180) + (long)local_24 * 4) != in_ESI) {
      local_24 = local_24 + 1;
    }
    *(undefined4 *)(*(long *)(in_RDI + 0x180) + (long)local_24 * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x180) + (long)iVar5 * 4);
    *(int *)(*(long *)(in_RDI + 0x180) + (long)iVar5 * 4) = in_ESI;
    *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar4 * 4) =
         *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar4 * 4) + -1;
  }
  local_1c = *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar9 * 4) -
             *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar9 * 4);
  while (*(int *)(*(long *)(in_RDI + 0x180) +
                 (long)(*(int *)(*(long *)(in_RDI + 0x1a0) + (long)iVar9 * 4) + local_1c) * 4) !=
         in_ESI) {
    updateRow(_m,lv,pcol,pval._4_4_,pval._0_4_,_plen,in_stack_00000010);
    local_1c = local_1c + 1;
  }
  iVar3 = *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar9 * 4);
  while (local_1c = local_1c + 1, local_1c < iVar3) {
    updateRow(_m,lv,pcol,pval._4_4_,pval._0_4_,_plen,in_stack_00000010);
  }
  *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar9 * 4) =
       *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar9 * 4) -
       *(int *)(*(long *)(in_RDI + 0x200) + (long)iVar9 * 4);
  local_1c = *(int *)(*(long *)(in_RDI + 0x140) + (long)in_ESI * 4);
  iVar2 = local_1c + iVar2;
  for (; local_1c < iVar2; local_1c = local_1c + 1) {
    iVar9 = *(int *)(*(long *)(in_RDI + 0x138) + (long)local_1c * 4);
    *(undefined8 *)(*(long *)(in_RDI + 0x1b8) + (long)iVar9 * 8) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x1e0) + (long)iVar9 * 4) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20) =
         *(undefined8 *)
          (*(long *)(in_RDI + 0x238) +
          (long)*(int *)(*(long *)(in_RDI + 0x200) + (long)iVar9 * 4) * 0x20);
    *(long *)(*(long *)(*(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20) + 8) =
         *(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20;
    *(long *)(*(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20 + 8) =
         *(long *)(in_RDI + 0x238) +
         (long)*(int *)(*(long *)(in_RDI + 0x200) + (long)iVar9 * 4) * 0x20;
    *(long *)(*(long *)(in_RDI + 0x238) +
             (long)*(int *)(*(long *)(in_RDI + 0x200) + (long)iVar9 * 4) * 0x20) =
         *(long *)(in_RDI + 0x230) + (long)iVar9 * 0x20;
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminatePivot(int prow, int pos, R eps)
{
   int i, j, k, m = -1;
   int lv = -1;  // This value should never be used.
   int pcol;
   R pval;
   int pbeg = u.row.start[prow];
   int plen = --(u.row.len[prow]);
   int pend = pbeg + plen;


   /*  extract pivot element   */
   i = pbeg + pos;
   pcol = u.row.idx[i];
   pval = u.row.val[i];
   removeDR(temp.pivot_col[pcol]);
   initDR(temp.pivot_col[pcol]);

   /*  remove pivot from pivot row     */
   u.row.idx[i] = u.row.idx[pend];
   u.row.val[i] = u.row.val[pend];

   /*  set pivot element and construct L VectorBase<R> */
   setPivot(temp.stage++, pcol, prow, pval);

   /**@todo If this test failes, lv has no value. I suppose that in this
    *       case none of the loops below that uses lv is executed.
    *       But this is unproven.
    */

   if(temp.s_cact[pcol] - 1 > 0)
      lv = makeLvec(temp.s_cact[pcol] - 1, prow);

   /*  init working VectorBase<R>,
    *  remove pivot row from working matrix
    *  and remove columns from list.
    */
   for(i = pbeg; i < pend; ++i)
   {
      j = u.row.idx[i];
      temp.s_mark[j] = 1;
      work[j] = u.row.val[i];
      removeDR(temp.pivot_col[j]);
      m = u.col.start[j] + u.col.len[j] - temp.s_cact[j];

      for(k = m; u.col.idx[k] != prow; ++k)
         ;

      u.col.idx[k] = u.col.idx[m];

      u.col.idx[m] = prow;

      temp.s_cact[j]--;
   }

   /*  perform L and update loop
    */
   for(i = u.col.len[pcol] - temp.s_cact[pcol];
         (m = u.col.idx[u.col.start[pcol] + i]) != prow;
         ++i)
   {
      assert(row.perm[m] < 0);
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(m, lv++, prow, pcol, pval, eps);
   }

   /*  skip pivot row  */

   m = u.col.len[pcol];

   for(++i; i < m; ++i)
   {
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(u.col.idx[u.col.start[pcol] + i], lv++, prow, pcol, pval, eps);
   }

   /*  remove pivot column from column file.
    */
   u.col.len[pcol] -= temp.s_cact[pcol];

   /*  clear working VectorBase<R> and reinsert columns to lists
    */
   for(i = u.row.start[prow], pend = i + plen; i < pend; ++i)
   {
      j = u.row.idx[i];
      work[j] = 0;
      temp.s_mark[j] = 0;
      init2DR(temp.pivot_col[j], temp.pivot_colNZ[temp.s_cact[j]]);
      assert(col.perm[j] < 0);
   }
}